

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::HorizontalLinesDoesNothing(VectorRasterizerTests *this)

{
  cell reference [1];
  vector_rasterizer vr;
  allocator local_d9;
  cell local_d8;
  string local_c8;
  LocationInfo local_a8;
  vector_rasterizer local_80;
  
  vector_rasterizer::vector_rasterizer(&local_80);
  vector_rasterizer::line(&local_80,0xa00,0xf80,0x4600,0xf80);
  local_d8.cover = 0;
  local_d8.x = 0;
  local_d8.y = 0;
  local_d8.area = 0;
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_d9);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0xa3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_d8,&local_80._cells,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::line(&local_80,0xa00,0xd80,0x4600,0xd80);
  vector_rasterizer::line(&local_80,0xb4d,-0x1180,0x1d00,-0x1180);
  vector_rasterizer::line(&local_80,-0xa00,0xd780,-0x4600,0xd780);
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_d9);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0xab);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_d8,&local_80._cells,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&local_80);
  return;
}

Assistant:

test( HorizontalLinesDoesNothing )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(10.0), fp(15.5), fp(70.0), fp(15.5));

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ },
				};

				assert_equal(reference, vr.cells());

				// ACT
				vr.line(fp(10.0), fp(13.5), fp(70.0), fp(13.5));
				vr.line(fp(11.3), fp(-17.5), fp(29.0), fp(-17.5));
				vr.line(fp(-10.0), fp(215.5), fp(-70.0), fp(215.5));

				// ASSERT
				assert_equal(reference, vr.cells());
			}